

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.h
# Opt level: O1

void fidentity8x8_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  __m128i alVar1;
  
  alVar1 = (__m128i)paddsw((undefined1  [16])*input,(undefined1  [16])*input);
  *output = alVar1;
  alVar1 = (__m128i)paddsw((undefined1  [16])input[1],(undefined1  [16])input[1]);
  output[1] = alVar1;
  alVar1 = (__m128i)paddsw((undefined1  [16])input[2],(undefined1  [16])input[2]);
  output[2] = alVar1;
  alVar1 = (__m128i)paddsw((undefined1  [16])input[3],(undefined1  [16])input[3]);
  output[3] = alVar1;
  alVar1 = (__m128i)paddsw((undefined1  [16])input[4],(undefined1  [16])input[4]);
  output[4] = alVar1;
  alVar1 = (__m128i)paddsw((undefined1  [16])input[5],(undefined1  [16])input[5]);
  output[5] = alVar1;
  alVar1 = (__m128i)paddsw((undefined1  [16])input[6],(undefined1  [16])input[6]);
  output[6] = alVar1;
  alVar1 = (__m128i)paddsw((undefined1  [16])input[7],(undefined1  [16])input[7]);
  output[7] = alVar1;
  return;
}

Assistant:

static inline void fidentity8x8_new_sse2(const __m128i *input, __m128i *output,
                                         int8_t cos_bit) {
  (void)cos_bit;

  output[0] = _mm_adds_epi16(input[0], input[0]);
  output[1] = _mm_adds_epi16(input[1], input[1]);
  output[2] = _mm_adds_epi16(input[2], input[2]);
  output[3] = _mm_adds_epi16(input[3], input[3]);
  output[4] = _mm_adds_epi16(input[4], input[4]);
  output[5] = _mm_adds_epi16(input[5], input[5]);
  output[6] = _mm_adds_epi16(input[6], input[6]);
  output[7] = _mm_adds_epi16(input[7], input[7]);
}